

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd_nnquant.c
# Opt level: O2

void writecolourmap(nn_quant *nnq,FILE *f)

{
  uint uVar1;
  int *piVar2;
  long lVar3;
  
  for (uVar1 = 3; -1 < (int)uVar1; uVar1 = uVar1 - 1) {
    piVar2 = nnq->network[0] + uVar1;
    for (lVar3 = 0; lVar3 < nnq->netsize; lVar3 = lVar3 + 1) {
      putc(*piVar2,(FILE *)f);
      piVar2 = piVar2 + 5;
    }
  }
  return;
}

Assistant:

void writecolourmap(nnq, f)
nn_quant *nnq;
FILE *f;
{
	int i,j;

	for (i=3; i>=0; i--)
		for (j=0; j < nnq->netsize; j++)
			putc(nnq->network[j][i], f);
}